

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

void duckdb::UncompressedStringStorage::StringScanPartial
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  int dict_offset;
  idx_t iVar1;
  idx_t iVar2;
  int iVar3;
  uint32_t dict_end_offset;
  int iVar4;
  pointer pSVar5;
  data_ptr_t pdVar6;
  long lVar7;
  data_ptr_t pdVar8;
  int iVar9;
  idx_t iVar10;
  string_t sVar11;
  
  pSVar5 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  iVar10 = state->row_index;
  iVar1 = (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pdVar6 = BufferHandle::Ptr((BufferHandle *)(pSVar5 + 1));
  iVar2 = segment->offset;
  dict_end_offset = GetDictionaryEnd(segment,(BufferHandle *)(pSVar5 + 1));
  iVar4 = 0;
  lVar7 = iVar10 - iVar1;
  if (lVar7 != 0) {
    iVar4 = *(int *)(pdVar6 + lVar7 * 4 + iVar2 + 4);
  }
  lVar7 = lVar7 * 4 + iVar2 + 8;
  pdVar8 = result->data + result_offset * 0x10 + 8;
  for (iVar10 = 0; scan_count != iVar10; iVar10 = iVar10 + 1) {
    dict_offset = *(int *)(pdVar6 + iVar10 * 4 + lVar7);
    iVar3 = -dict_offset;
    if (0 < dict_offset) {
      iVar3 = dict_offset;
    }
    iVar9 = -iVar4;
    if (iVar4 < 1) {
      iVar9 = iVar4;
    }
    sVar11 = FetchStringFromDict(segment,dict_end_offset,result,pdVar6 + iVar2,dict_offset,
                                 iVar9 + iVar3);
    *(long *)(pdVar8 + -8) = sVar11.value._0_8_;
    *(long *)pdVar8 = sVar11.value._8_8_;
    iVar4 = *(int *)(pdVar6 + iVar10 * 4 + lVar7);
    pdVar8 = pdVar8 + 0x10;
  }
  return;
}

Assistant:

void UncompressedStringStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count,
                                                  Vector &result, idx_t result_offset) {
	// clear any previously locked buffers and get the primary buffer handle
	auto &scan_state = state.scan_state->Cast<StringScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict_end = GetDictionaryEnd(segment, scan_state.handle);
	auto base_data = reinterpret_cast<int32_t *>(baseptr + DICTIONARY_HEADER_SIZE);
	auto result_data = FlatVector::GetData<string_t>(result);

	int32_t previous_offset = start > 0 ? base_data[start - 1] : 0;

	for (idx_t i = 0; i < scan_count; i++) {
		// std::abs used since offsets can be negative to indicate big strings
		auto current_offset = base_data[start + i];
		auto string_length = UnsafeNumericCast<uint32_t>(std::abs(current_offset) - std::abs(previous_offset));
		result_data[result_offset + i] =
		    FetchStringFromDict(segment, dict_end, result, baseptr, current_offset, string_length);
		previous_offset = base_data[start + i];
	}
}